

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O2

void duckdb::TemplatedListReader::HandleNull(DATA *data,idx_t offset)

{
  list_entry_t *plVar1;
  
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&data->result_mask->super_TemplatedValidityMask<unsigned_long>,offset);
  plVar1 = data->result_ptr;
  plVar1[offset].offset = 0;
  plVar1[offset].length = 0;
  return;
}

Assistant:

static void HandleNull(DATA &data, idx_t offset) {
		data.result_mask.SetInvalid(offset);
		data.result_ptr[offset].offset = 0;
		data.result_ptr[offset].length = 0;
	}